

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O0

void dg::pta::removeNode(PointerGraph *G,PSNode *nd)

{
  char *in_RSI;
  PointerGraph *in_RDI;
  SubgraphNode<dg::pta::PSNode> *in_stack_00000100;
  
  SubgraphNode<dg::pta::PSNode>::isolate(in_stack_00000100);
  SubgraphNode<dg::pta::PSNode>::removeAllOperands((SubgraphNode<dg::pta::PSNode> *)G);
  PointerGraph::remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeNode(PointerGraph *G, PSNode *nd) {
    // llvm::errs() << "Remove node " << nd->getID() << "\n";

    assert(nd->getUsers().empty() && "Removing node that has users");
    // remove from CFG
    nd->isolate();
    // clear its operands (so that the operands do not
    // have a dangling reference to this node in 'users')
    nd->removeAllOperands();
    // delete it from the graph
    G->remove(nd);
}